

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

int vcf_hdr_write(htsFile *fp,bcf_hdr_t *h)

{
  int iVar1;
  char *buffer;
  ssize_t sVar2;
  bool bVar3;
  int local_2c;
  int ret;
  char *htxt;
  bcf_hdr_t *pbStack_18;
  int hlen;
  bcf_hdr_t *h_local;
  htsFile *fp_local;
  
  pbStack_18 = h;
  h_local = (bcf_hdr_t *)fp;
  buffer = bcf_hdr_fmt_text(h,0,(int *)((long)&htxt + 4));
  while( true ) {
    bVar3 = false;
    if (htxt._4_4_ != 0) {
      bVar3 = buffer[htxt._4_4_ + -1] == '\0';
    }
    if (!bVar3) break;
    htxt._4_4_ = htxt._4_4_ + -1;
  }
  if (*(int *)((long)&h_local->hrec + 4) == 0) {
    sVar2 = hwrite((hFILE *)h_local->dict[2],buffer,(long)htxt._4_4_);
    local_2c = (int)sVar2;
  }
  else {
    sVar2 = bgzf_write((BGZF *)h_local->dict[2],buffer,(long)htxt._4_4_);
    local_2c = (int)sVar2;
  }
  free(buffer);
  iVar1 = 0;
  if (local_2c < 0) {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int vcf_hdr_write(htsFile *fp, const bcf_hdr_t *h)
{
    int hlen;
    char *htxt = bcf_hdr_fmt_text(h, 0, &hlen);
    while (hlen && htxt[hlen-1] == 0) --hlen; // kill trailing zeros
    int ret;
    if ( fp->format.compression!=no_compression )
        ret = bgzf_write(fp->fp.bgzf, htxt, hlen);
    else
        ret = hwrite(fp->fp.hfile, htxt, hlen);
    free(htxt);
    return ret<0 ? -1 : 0;
}